

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O1

void ggml_backend_cpu_set_threadpool(ggml_backend_t backend_cpu,ggml_threadpool_t threadpool)

{
  void *pvVar1;
  ggml_threadpool *threadpool_00;
  char cVar2;
  
  if (backend_cpu != (ggml_backend_t)0x0) {
    cVar2 = ggml_guid_matches(backend_cpu->guid,ggml_backend_cpu_guid()::guid);
    if (cVar2 != '\0') {
      pvVar1 = backend_cpu->context;
      threadpool_00 = *(ggml_threadpool **)((long)pvVar1 + 8);
      if (threadpool_00 != threadpool && threadpool_00 != (ggml_threadpool *)0x0) {
        ggml_threadpool_pause(threadpool_00);
      }
      *(ggml_threadpool_t *)((long)pvVar1 + 8) = threadpool;
      return;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.cpp"
             ,0xeb,"GGML_ASSERT(%s) failed","ggml_backend_is_cpu(backend_cpu)");
}

Assistant:

void ggml_backend_cpu_set_threadpool(ggml_backend_t backend_cpu, ggml_threadpool_t threadpool) {
    GGML_ASSERT(ggml_backend_is_cpu(backend_cpu));

    struct ggml_backend_cpu_context * ctx = (struct ggml_backend_cpu_context *)backend_cpu->context;

    if (ctx->threadpool && ctx->threadpool != threadpool) {
        // already had a different threadpool, pause/suspend it before switching
        ggml_threadpool_pause(ctx->threadpool);
    }
    ctx->threadpool = threadpool;
}